

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::aEnqueue(SAT *this,Lit p,Reason r,int l)

{
  uint uVar1;
  ostream *poVar2;
  Lit n;
  string local_70;
  string local_50 [32];
  
  if (so.debug) {
    n.x = p.x;
    poVar2 = std::operator<<((ostream *)&std::cerr,"a-enqueue literal ");
    getLitString_abi_cxx11_(n.x);
    poVar2 = std::operator<<(poVar2,local_50);
    poVar2 = std::operator<<(poVar2," because ");
    showReason_abi_cxx11_(&local_70,r);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2," and l=");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,l);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string(local_50);
  }
  uVar1 = p.x >> 1;
  (this->assigns).data[uVar1] = -((byte)p.x & 1) | 1;
  (this->trailpos).data[uVar1] = engine.trail_lim.data[(uint)l] + -1;
  (this->reason).data[uVar1].field_0 = r.field_0;
  vec<Lit>::push((this->trail).data + (uint)l,(Lit *)&stack0xffffffffffffff8c);
  return;
}

Assistant:

void SAT::aEnqueue(Lit p, Reason r, int l) {
	if (so.debug) {
		std::cerr << "a-enqueue literal " << getLitString(toInt(p)) << " because " << showReason(r)
							<< " and l=" << l << "\n";
	}
	assert(value(p) == l_Undef);
	const int v = var(p);
	assigns[v] = toInt(lbool(!sign(p)));
	trailpos[v] = engine.trail_lim[l] - 1;
	reason[v] = r;
	trail[l].push(p);
}